

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanMemoryManager.cpp
# Opt level: O1

VulkanMemoryAllocation * __thiscall
VulkanUtilities::VulkanMemoryManager::Allocate
          (VulkanMemoryAllocation *__return_storage_ptr__,VulkanMemoryManager *this,
          VkMemoryRequirements *MemReqs,VkMemoryPropertyFlags MemoryProps,
          VkMemoryAllocateFlags AllocateFlags)

{
  uint32_t MemoryTypeIndex;
  string msg;
  string local_50;
  
  MemoryTypeIndex =
       VulkanPhysicalDevice::GetMemoryTypeIndex
                 (this->m_PhysicalDevice,MemReqs->memoryTypeBits,MemoryProps);
  if (MemoryProps == 6) {
    if (MemoryTypeIndex != 0xffffffff) goto LAB_00297c81;
    Diligent::FormatString<char[493]>
              (&local_50,
               (char (*) [493])
               "Vulkan spec requires that for a VkBuffer not created with the VK_BUFFER_CREATE_SPARSE_BINDING_BIT bit set, or for a VkImage that was created with a VK_IMAGE_TILING_LINEAR value in the tiling member of the VkImageCreateInfo structure passed to vkCreateImage, the memoryTypeBits member always contains at least one bit set corresponding to a VkMemoryType with a propertyFlags that has both the VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT bit AND the VK_MEMORY_PROPERTY_HOST_COHERENT_BIT bit set. (11.6)"
              );
    Diligent::DebugAssertionFailed
              (local_50._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
               ,0x96);
  }
  else {
    if (MemoryProps != 1) {
      if (MemoryTypeIndex == 0xffffffff) {
        Diligent::LogError<true,char[56]>
                  (false,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
                   ,0x9a,(char (*) [56])"Failed to find suitable device memory type for a buffer");
      }
      goto LAB_00297c81;
    }
    if (MemoryTypeIndex != 0xffffffff) goto LAB_00297c81;
    Diligent::FormatString<char[202]>
              (&local_50,
               (char (*) [202])
               "Vulkan spec requires that memoryTypeBits member always contains at least one bit set corresponding to a VkMemoryType with a propertyFlags that has the VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT bit set (11.6)"
              );
    Diligent::DebugAssertionFailed
              (local_50._M_dataplus._M_p,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanMemoryManager.cpp"
               ,0x8d);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
LAB_00297c81:
  Allocate(__return_storage_ptr__,this,MemReqs->size,MemReqs->alignment,MemoryTypeIndex,
           SUB41((MemoryProps & 2) >> 1,0),AllocateFlags);
  return __return_storage_ptr__;
}

Assistant:

VulkanMemoryAllocation VulkanMemoryManager::Allocate(const VkMemoryRequirements& MemReqs, VkMemoryPropertyFlags MemoryProps, VkMemoryAllocateFlags AllocateFlags)
{
    // memoryTypeBits is a bitmask and contains one bit set for every supported memory type for the resource.
    // Bit i is set if the memory type i in the VkPhysicalDeviceMemoryProperties structure for the
    // physical device is supported for the resource.
    auto MemoryTypeIndex = m_PhysicalDevice.GetMemoryTypeIndex(MemReqs.memoryTypeBits, MemoryProps);
    if (MemoryProps == VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT)
    {
        // There must be at least one memory type with the DEVICE_LOCAL_BIT bit set
        DEV_CHECK_ERR(MemoryTypeIndex != VulkanUtilities::VulkanPhysicalDevice::InvalidMemoryTypeIndex,
                      "Vulkan spec requires that memoryTypeBits member always contains "
                      "at least one bit set corresponding to a VkMemoryType with a propertyFlags that has the "
                      "VK_MEMORY_PROPERTY_DEVICE_LOCAL_BIT bit set (11.6)");
    }
    else if (MemoryProps == (VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT | VK_MEMORY_PROPERTY_HOST_COHERENT_BIT))
    {
        DEV_CHECK_ERR(MemoryTypeIndex != VulkanUtilities::VulkanPhysicalDevice::InvalidMemoryTypeIndex,
                      "Vulkan spec requires that for a VkBuffer not created with the VK_BUFFER_CREATE_SPARSE_BINDING_BIT "
                      "bit set, or for a VkImage that was created with a VK_IMAGE_TILING_LINEAR value in the tiling member "
                      "of the VkImageCreateInfo structure passed to vkCreateImage, the memoryTypeBits member always contains "
                      "at least one bit set corresponding to a VkMemoryType with a propertyFlags that has both the "
                      "VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT bit AND the VK_MEMORY_PROPERTY_HOST_COHERENT_BIT bit set. (11.6)");
    }
    else if (MemoryTypeIndex == VulkanUtilities::VulkanPhysicalDevice::InvalidMemoryTypeIndex)
    {
        LOG_ERROR_AND_THROW("Failed to find suitable device memory type for a buffer");
    }

    bool HostVisible = (MemoryProps & VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT) != 0;
    return Allocate(MemReqs.size, MemReqs.alignment, MemoryTypeIndex, HostVisible, AllocateFlags);
}